

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# S2Test.cpp
# Opt level: O2

void __thiscall RandomS2IsInM::test_method(RandomS2IsInM *this)

{
  Index size;
  RandomReturnType local_288;
  shared_count sStack_278;
  char *local_270;
  char *local_268;
  undefined **local_260;
  undefined1 local_258;
  undefined8 *local_250;
  char **local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  S2 S;
  Point y;
  
  mnf::S2::S2(&S);
  mnf::Manifold::createRandomPoint(1.0);
  local_1f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f0,0x4e);
  local_288.m_rows.m_value._0_1_ = mnf::Point::isInM(1e-12);
  local_288._8_8_ = 0;
  sStack_278.pi_ = (sp_counted_base *)0x0;
  local_270 = "y.isInM()";
  local_268 = "";
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_00137c98;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_210 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
  ;
  local_208 = "";
  local_248 = &local_270;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_278);
  size = mnf::Manifold::representationDim();
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Random(&local_288,size);
  mnf::SubPoint::value();
  Eigen::internal::
  call_assignment<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)&local_260,
             &local_288);
  local_220 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_220,0x50);
  local_288.m_rows.m_value._0_1_ = mnf::Point::isInM(1e-12);
  local_288.m_rows.m_value._0_1_ = (byte)local_288.m_rows.m_value ^ 1;
  local_288._8_8_ = 0;
  sStack_278.pi_ = (sp_counted_base *)0x0;
  local_270 = "!y.isInM()";
  local_268 = "";
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_00137c98;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
  ;
  local_238 = "";
  local_248 = &local_270;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_278);
  mnf::Point::~Point(&y);
  mnf::Manifold::~Manifold((Manifold *)&S);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(RandomS2IsInM)
{
  S2 S;
  Point y = S.createRandomPoint();
  BOOST_CHECK(y.isInM());
  y.value() = Eigen::VectorXd::Random(S.representationDim());
  BOOST_CHECK(!y.isInM());
}